

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_27(QPDF *pdf,char *arg2)

{
  Provider *pPVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  QPDFObjectHandle QVar2;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  shared_ptr<Buffer> b;
  allocator<char> local_241;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238 [6];
  QPDF oldpdf;
  QPDF empty3;
  QPDFObjectHandle qtest2;
  QPDF empty2;
  QPDF empty1;
  QPDFObjectHandle s1;
  QPDFObjectHandle s3;
  QPDFObjectHandle trailer;
  QPDFObjectHandle O3;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p2;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p1;
  allocator<char> local_170 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  QPDFObjectHandle s2;
  QPDFObjectHandle qtest;
  string local_140 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_a0;
  QPDFPageObjectHelper local_90;
  QPDFPageObjectHelper local_58;
  
  p1.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p1.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)&w,"buffer",(Pipeline *)0x0);
  Pipeline::writeCStr((char *)&w);
  Pl_Buffer::finish();
  Pl_Buffer::getBufferSharedPointer();
  pPVar1 = (Provider *)operator_new(0x28);
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  Provider::Provider(pPVar1,(shared_ptr<Buffer> *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Provider,void>
            ((__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2> *)&s1,
             pPVar1);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&p1.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> *)&s1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&w);
  QPDF::QPDF(&empty1);
  QPDF::emptyPDF();
  QPDFObjectHandle::newStream((QPDF *)&s1);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,
             &p1.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData(&s1,&local_120,&w,&b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  QPDF::QPDF(&empty2);
  QPDF::emptyPDF();
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s1);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&empty2;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&w;
  QPDF::copyForeignObject(QVar2);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s1,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  p2.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p2.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)&w,"buffer",(Pipeline *)0x0);
  Pipeline::writeCStr((char *)&w);
  Pl_Buffer::finish();
  Pl_Buffer::getBufferSharedPointer();
  pPVar1 = (Provider *)operator_new(0x28);
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c0,&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  Provider::Provider(pPVar1,(shared_ptr<Buffer> *)&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Provider,void>
            ((__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2> *)&s3,
             pPVar1);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&p2.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> *)&s3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&w);
  QPDF::QPDF(&empty3);
  QPDF::emptyPDF();
  QPDF::setImmediateCopyFrom(false);
  QPDFObjectHandle::newStream((QPDF *)&s3);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_130,
             &p2.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData(&s3,&local_130,&w,&b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  if (arg2 != (char *)0x0) {
    QPDF::QPDF(&oldpdf);
    QPDF::processFile((char *)&oldpdf,arg2);
    QPDF::getTrailer();
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/QTest",(allocator<char> *)&O3)
    ;
    QPDFObjectHandle::getKey((string *)&qtest);
    std::__cxx11::string::~string((string *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/O3",(allocator<char> *)&b);
    QPDFObjectHandle::getKey((string *)&O3);
    std::__cxx11::string::~string((string *)&w);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w,pdf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&b,"/OtherPage",(allocator<char> *)&s2);
    QPDFObjectHandle::getKey(local_140);
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_140;
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_58,QVar7);
    QPDFPageDocumentHelper::addPage((QPDFPageObjectHelper *)&w,SUB81(&local_58,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138);
    std::__cxx11::string::~string((string *)&b);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&O3);
    QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX_00._M_pi;
    QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_d0;
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_90,QVar8);
    QPDFPageDocumentHelper::addPage((QPDFPageObjectHelper *)&w,SUB81(&local_90,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&b,"potato\n",(allocator<char> *)&trailer);
    QPDFObjectHandle::newStream((QPDF *)&s2,(string *)&oldpdf);
    std::__cxx11::string::~string((string *)&b);
    QPDF::getTrailer();
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"/QTest",local_170);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&qtest);
    QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&qtest2;
    QPDF::copyForeignObject(QVar3);
    QPDFObjectHandle::replaceKey((string *)&trailer,(QPDFObjectHandle *)&b);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&qtest2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"/QTest2",&local_241);
    QPDFObjectHandle::newArray();
    QPDFObjectHandle::replaceKeyAndGetNew((string *)&qtest2,&trailer);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
    std::__cxx11::string::~string((string *)&b);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s1);
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&b;
    QPDF::copyForeignObject(QVar4);
    QPDFObjectHandle::appendItem(&qtest2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_100,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s2);
    QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&b;
    QPDF::copyForeignObject(QVar5);
    QPDFObjectHandle::appendItem(&qtest2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_110,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s3);
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&b;
    QPDF::copyForeignObject(QVar6);
    QPDFObjectHandle::appendItem(&qtest2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&qtest2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&trailer.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&s2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&O3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&qtest.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDF::~QPDF(&oldpdf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&s3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDF::~QPDF(&empty3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p2.
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(&w,0));
    QPDFWriter::setCompressStreams(SUB81(&w,0));
    QPDFWriter::setDecodeLevel((qpdf_stream_decode_level_e)&w);
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
    QPDF::~QPDF(&empty2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&s1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDF::~QPDF(&empty1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p1.
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x41b,"void test_27(QPDF &, const char *)");
}

Assistant:

static void
test_27(QPDF& pdf, char const* arg2)
{
    // Copy O3 and the page O3 refers to before copying qtest.
    // Should get qtest plus only the O3 page and the page that O3
    // points to. Inherited objects should be preserved. This test
    // also exercises copying from a stream that has a buffer and
    // a provider, including copying a provider multiple times. We
    // also exercise setImmediateCopyFrom.

    // Create a provider. The provider stays in scope.
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> p1;
    {
        // Local scope
        Pl_Buffer pl("buffer");
        pl.writeCStr("new data for stream\n");
        pl.finish();
        auto b = pl.getBufferSharedPointer();
        auto* provider = new Provider(b);
        p1 = decltype(p1)(provider);
    }
    // Create a stream that uses a provider in empty1 and copy it
    // to empty2. It is copied from empty2 to the final pdf.
    QPDF empty1;
    empty1.emptyPDF();
    QPDFObjectHandle s1 = QPDFObjectHandle::newStream(&empty1);
    s1.replaceStreamData(p1, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    QPDF empty2;
    empty2.emptyPDF();
    s1 = empty2.copyForeignObject(s1);
    {
        // Make sure some source PDFs are out of scope when we
        // write.

        std::shared_ptr<QPDFObjectHandle::StreamDataProvider> p2;
        // Create another provider. This one will go out of scope
        // along with its containing qpdf, which has
        // setImmediateCopyFrom(true).
        {
            // Local scope
            Pl_Buffer pl("buffer");
            pl.writeCStr("more data for stream\n");
            pl.finish();
            auto b = pl.getBufferSharedPointer();
            auto* provider = new Provider(b);
            p2 = decltype(p2)(provider);
        }
        QPDF empty3;
        empty3.emptyPDF();
        empty3.setImmediateCopyFrom(true);
        QPDFObjectHandle s3 = QPDFObjectHandle::newStream(&empty3);
        s3.replaceStreamData(p2, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
        assert(arg2 != nullptr);
        QPDF oldpdf;
        oldpdf.processFile(arg2);
        QPDFObjectHandle qtest = oldpdf.getTrailer().getKey("/QTest");
        QPDFObjectHandle O3 = qtest.getKey("/O3");
        QPDFPageDocumentHelper dh(pdf);
        dh.addPage(O3.getKey("/OtherPage"), false);
        dh.addPage(O3, false);
        QPDFObjectHandle s2 = QPDFObjectHandle::newStream(&oldpdf, "potato\n");
        auto trailer = pdf.getTrailer();
        trailer.replaceKey("/QTest", pdf.copyForeignObject(qtest));
        auto qtest2 = trailer.replaceKeyAndGetNew("/QTest2", QPDFObjectHandle::newArray());
        qtest2.appendItem(pdf.copyForeignObject(s1));
        qtest2.appendItem(pdf.copyForeignObject(s2));
        qtest2.appendItem(pdf.copyForeignObject(s3));
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setCompressStreams(false);
    w.setDecodeLevel(qpdf_dl_generalized);
    w.write();
}